

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_enc.c
# Opt level: O0

uint32_t AddToken(VP8TBuffer *b,uint32_t bit,uint32_t proba_idx,proba_t *stats)

{
  int iVar1;
  VP8TBuffer *in_RCX;
  ushort in_DX;
  uint32_t in_ESI;
  long in_RDI;
  int slot;
  
  if (*(int *)(in_RDI + 0x18) < 1) {
    iVar1 = TBufferNewPage(in_RCX);
    if (iVar1 == 0) goto LAB_001842b2;
  }
  iVar1 = *(int *)(in_RDI + 0x18) + -1;
  *(int *)(in_RDI + 0x18) = iVar1;
  *(ushort *)(*(long *)(in_RDI + 0x10) + (long)iVar1 * 2) = (ushort)(in_ESI << 0xf) | in_DX;
LAB_001842b2:
  VP8RecordStats(in_ESI,(proba_t *)in_RCX);
  return in_ESI;
}

Assistant:

static WEBP_INLINE uint32_t AddToken(VP8TBuffer* const b, uint32_t bit,
                                     uint32_t proba_idx,
                                     proba_t* const stats) {
  assert(proba_idx < FIXED_PROBA_BIT);
  assert(bit <= 1);
  if (b->left_ > 0 || TBufferNewPage(b)) {
    const int slot = --b->left_;
    b->tokens_[slot] = (bit << 15) | proba_idx;
  }
  VP8RecordStats(bit, stats);
  return bit;
}